

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

iuIParamGenerator<std::tuple<bool,_int,_int>_> * __thiscall
iutest::detail::iuValueArray::operator_cast_to_iuIParamGenerator_(iuValueArray *this)

{
  iuValuesInParamsGenerator<int> *this_00;
  make_array<int> local_14;
  iuValueArray *piStack_10;
  make_array<int> ar;
  iuValueArray<int> *this_local;
  
  piStack_10 = this;
  iuValueArray<int>::make_array<int>::make_array(&local_14,(_MyTuple *)this);
  this_00 = (iuValuesInParamsGenerator<int> *)operator_new(0x28);
  iuValuesInParamsGenerator<int>::iuValuesInParamsGenerator<int,1ul>(this_00,local_14.val);
  return (iuIParamGenerator<std::tuple<bool,_int,_int>_> *)this_00;
}

Assistant:

operator iuIParamGenerator<T>* () const
    {
        make_array<T> ar(v);
#if !defined(IUTEST_NO_FUNCTION_TEMPLATE_ORDERING)
        return new iuValuesInParamsGenerator<T>(ar.val);
#else
        return new iuValuesInParamsGenerator<T>(ar.val, ar.val + IUTEST_PP_COUNTOF(ar.val));
#endif
    }